

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewind.c
# Opt level: O0

Ticks rewind_get_newest_ticks(RewindBuffer *buffer)

{
  Bool BVar1;
  int local_24;
  int i;
  RewindInfoRange *info_range;
  RewindBuffer *buffer_local;
  
  local_24 = 0;
  while( true ) {
    if (1 < local_24) {
      return 0xffffffffffffffff;
    }
    BVar1 = is_rewind_range_empty(buffer->info_range + local_24);
    if (BVar1 == FALSE) break;
    local_24 = local_24 + 1;
  }
  return (buffer->info_range[local_24].begin)->ticks;
}

Assistant:

Ticks rewind_get_newest_ticks(RewindBuffer* buffer) {
  RewindInfoRange* info_range = buffer->info_range;

  int i;
  for (i = 0; i < 2; ++i) {
    if (!is_rewind_range_empty(&info_range[i])) {
      return info_range[i].begin[0].ticks;
    }
  }

  return INVALID_TICKS;
}